

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

object_ptr __thiscall
mjs::interpreter::impl::create_function
          (impl *this,string *id,shared_ptr<mjs::block_statement> *block,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *param_names,wstring *body_text,scope_ptr *prev_scope)

{
  gc_heap *h;
  function_object *pfVar1;
  statement *s;
  undefined8 extraout_RDX;
  object_ptr oVar2;
  gc_heap_ptr<mjs::function_object> callee;
  anon_class_144_7_2443f645_for_f func;
  allocator<wchar_t> local_191;
  gc_heap_ptr_untyped local_190;
  gc_heap_ptr_untyped local_180;
  gc_heap_ptr_untyped *local_170;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_168;
  anon_class_48_3_9fe6017f_for_f local_160;
  gc_heap_ptr_untyped local_130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_120;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_100;
  anon_class_144_7_2443f645_for_f local_e0;
  wstring_view local_50;
  wstring_view local_40;
  
  local_168 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              prev_scope;
  make_raw_function((mjs *)&local_190,(gc_heap_ptr<mjs::global_object> *)(id + 2));
  local_e0.this = (impl *)id;
  std::__shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2> *)param_names);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&local_e0.param_names,
           (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)body_text);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            (&local_e0.prev_scope.super_gc_heap_ptr_untyped,
             (gc_heap_ptr_untyped *)callee.super_gc_heap_ptr_untyped.heap_);
  local_170 = (gc_heap_ptr_untyped *)(id + 2);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_e0.callee.super_gc_heap_ptr_untyped,&local_190);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_e0.id,(gc_heap_ptr_untyped *)block);
  hoisting_visitor::scan_abi_cxx11_
            (&local_e0.hv_result,
             (hoisting_visitor *)
             (param_names->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,s);
  pfVar1 = (function_object *)gc_heap_ptr_untyped::get(&local_190);
  local_180.heap_ = (gc_heap *)0x0;
  local_180.pos_ = 0;
  h = (id->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  local_50 = string::view((string *)block);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_120,&local_50,&local_191);
  std::operator+(&local_100,L"function ",&local_120);
  std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 &local_160,&local_100,local_168);
  local_40._M_len = local_160.global.super_gc_heap_ptr_untyped._8_8_;
  local_40._M_str = (wchar_t *)local_160.global.super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_130,h,&local_40);
  function_object::
  put_function<mjs::interpreter::impl::create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
            (pfVar1,&local_e0,(gc_heap_ptr<mjs::gc_string> *)&local_180,
             (gc_heap_ptr<mjs::gc_string> *)&local_130,
             (int)(body_text->_M_string_length - (long)(body_text->_M_dataplus)._M_p >> 5));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_130);
  std::__cxx11::wstring::~wstring((wstring *)&local_160);
  std::__cxx11::wstring::~wstring((wstring *)&local_100);
  std::__cxx11::wstring::~wstring((wstring *)&local_120);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
  pfVar1 = (function_object *)gc_heap_ptr_untyped::get(&local_190);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_160,local_170);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_160.callee.super_gc_heap_ptr_untyped,&local_190);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_160.id,(gc_heap_ptr_untyped *)block);
  function_object::
  construct_function<mjs::interpreter::impl::create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
            (pfVar1,&local_160);
  create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)
  ::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#2}::~value
            ((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___2_
              *)&local_160);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,&local_190);
  create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)
  ::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}::~value
            ((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
              *)&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_190);
  oVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar2.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr create_function(const string& id, const std::shared_ptr<block_statement>& block, const std::vector<std::wstring>& param_names, const std::wstring& body_text, const scope_ptr& prev_scope) {
        // §15.3.2.1
        auto callee = make_raw_function(global_);
        auto func = [this, block, param_names, prev_scope, callee, id, hv_result = hoisting_visitor::scan(*block)](const value& this_, const std::vector<value>& args) {
            strict_mode_scope sms{*this, block->strict_mode()};
            // Scope
            auto activation = activation_object::make(global_, param_names, args);
            activation->put(global_->common_string("this"), block->strict_mode() ? this_ : get_this_arg(global_, this_), property_attribute::dont_delete | property_attribute::dont_enum | property_attribute::read_only);
            if (!strict_mode_) {
                activation->arguments()->put(global_->common_string("callee"), value{callee}, property_attribute::dont_enum);
            } else {
                global_->define_thrower_accessor(*activation->arguments(), "callee");
                global_->define_thrower_accessor(*activation->arguments(), "caller");
            }
            auto_scope auto_scope_{*this, activation, prev_scope};
            // Variables
            hoist(hv_result);
            if (!id.view().empty()) {
                // Add name of function to activation record even if it's not necessary for function_definition
                // It's needed for function expressions since `a=function x() { x(...); }` is legal, but x isn't added to the containing scope
                // TODO: Should actually be done a separate scope object (See ES3, 13)
                assert(!activation->has_property(id.view())); // TODO: Handle this..
                activation->put(id, value{callee}, property_attribute::dont_delete|property_attribute::read_only);
            }
            return top_level_eval(*block);
        };
        callee->put_function(func, nullptr, string{heap_, L"function " + std::wstring{id.view()} + body_text}.unsafe_raw_get(), static_cast<int>(param_names.size()));

        callee->construct_function([global = global_, callee, id](const value& this_, const std::vector<value>& args) {
            assert(this_.type() == value_type::undefined); (void)this_; // [[maybe_unused]] not working with MSVC here?
            assert(!id.view().empty());
            auto p = callee->get(L"prototype");
            auto o = value{global->heap().make<object>(id, p.type() == value_type::object ? p.object_value() : global->object_prototype())};
            auto r = callee->call(o, args);
            return r.type() == value_type::object ? r : value{o};
        });

        return callee;
    }